

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3StrHash(void *pKey,int nKey)

{
  char cVar1;
  size_t sVar2;
  uint uVar3;
  
  sVar2 = (size_t)(uint)nKey;
  if (nKey < 1) {
    sVar2 = strlen((char *)pKey);
  }
  uVar3 = 0;
  for (; 0 < (int)sVar2; sVar2 = (size_t)((int)sVar2 - 1)) {
    cVar1 = *pKey;
    pKey = (void *)((long)pKey + 1);
    uVar3 = uVar3 * 8 ^ uVar3 ^ (int)cVar1;
  }
  return uVar3 & 0x7fffffff;
}

Assistant:

static int fts3StrHash(const void *pKey, int nKey){
  const char *z = (const char *)pKey;
  unsigned h = 0;
  if( nKey<=0 ) nKey = (int) strlen(z);
  while( nKey > 0  ){
    h = (h<<3) ^ h ^ *z++;
    nKey--;
  }
  return (int)(h & 0x7fffffff);
}